

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O0

int __thiscall re2c::Go::init(Go *this,EVP_PKEY_CTX *ctx)

{
  uint32_t uVar1;
  bool bVar2;
  State *pSVar3;
  opt_t *poVar4;
  Dot *this_00;
  Cpgoto *this_01;
  GoBitmap *this_02;
  SwitchIf *this_03;
  uint32_t dSpans;
  BitMap *b;
  State *pSStack_40;
  uint32_t i_1;
  State *bitmap_state;
  BitMap *bitmap;
  uint32_t nBitmaps;
  uint32_t i;
  Span *hspan;
  uint32_t hSpans;
  State *from_local;
  Go *this_local;
  
  if (this->nSpans != 0) {
    hspan._4_4_ = 0;
    _nBitmaps = (Span *)0x0;
    for (bitmap._4_4_ = 0; bitmap._4_4_ < this->nSpans; bitmap._4_4_ = bitmap._4_4_ + 1) {
      if (0x100 < this->span[bitmap._4_4_].ub) {
        _nBitmaps = this->span + bitmap._4_4_;
        hspan._4_4_ = this->nSpans - bitmap._4_4_;
        break;
      }
    }
    bitmap._0_4_ = 0;
    bitmap_state = (State *)0x0;
    pSStack_40 = (State *)0x0;
    for (b._4_4_ = 0; b._4_4_ < this->nSpans; b._4_4_ = b._4_4_ + 1) {
      if (((((this->span[b._4_4_].to)->isBase & 1U) != 0) &&
          (pSVar3 = (State *)BitMap::find(this->span[b._4_4_].to), pSVar3 != (State *)0x0)) &&
         (bVar2 = matches(*(Span **)(*(long *)pSVar3 + 8),**(uint32_t **)pSVar3,
                          (State *)pSVar3->rule,this->span,this->nSpans,this->span[b._4_4_].to),
         bVar2)) {
        if (bitmap_state == (State *)0x0) {
          pSStack_40 = this->span[b._4_4_].to;
          bitmap_state = pSVar3;
        }
        bitmap._0_4_ = (int)bitmap + 1;
      }
    }
    uVar1 = this->nSpans;
    poVar4 = Opt::operator->((Opt *)&opts);
    if (poVar4->target == DOT) {
      this->type = DOT;
      this_00 = (Dot *)operator_new(0x10);
      Dot::Dot(this_00,this->span,this->nSpans,(State *)ctx);
      (this->info).dot = this_00;
    }
    else {
      poVar4 = Opt::operator->((Opt *)&opts);
      if (((poVar4->gFlag & 1U) == 0) ||
         (poVar4 = Opt::operator->((Opt *)&opts),
         (uVar1 - hspan._4_4_) - (int)bitmap < poVar4->cGotoThreshold)) {
        poVar4 = Opt::operator->((Opt *)&opts);
        if (((poVar4->bFlag & 1U) == 0) || ((int)bitmap == 0)) {
          this->type = SWITCH_IF;
          this_03 = (SwitchIf *)operator_new(0x10);
          SwitchIf::SwitchIf(this_03,this->span,this->nSpans,*(State **)(ctx + 0x10));
          (this->info).switchif = this_03;
        }
        else {
          this->type = BITMAP;
          this_02 = (GoBitmap *)operator_new(0x20);
          GoBitmap::GoBitmap(this_02,this->span,this->nSpans,_nBitmaps,hspan._4_4_,
                             (BitMap *)bitmap_state,pSStack_40,*(State **)(ctx + 0x10));
          (this->info).bitmap = this_02;
          this = (Go *)&bUsedYYBitmap;
          bUsedYYBitmap = 1;
        }
      }
      else {
        this->type = CPGOTO;
        this_01 = (Cpgoto *)operator_new(0x10);
        Cpgoto::Cpgoto(this_01,this->span,this->nSpans,_nBitmaps,hspan._4_4_,*(State **)(ctx + 0x10)
                      );
        (this->info).cpgoto = this_01;
      }
    }
  }
  return (int)this;
}

Assistant:

void Go::init (const State * from)
{
	if (nSpans == 0)
	{
		return;
	}

	// initialize high (wide) spans
	uint32_t hSpans = 0;
	const Span * hspan = NULL;
	for (uint32_t i = 0; i < nSpans; ++i)
	{
		if (span[i].ub > 0x100)
		{
			hspan = &span[i];
			hSpans = nSpans - i;
			break;
		}
	}

	// initialize bitmaps
	uint32_t nBitmaps = 0;
	const BitMap * bitmap = NULL;
	const State * bitmap_state = NULL;
	for (uint32_t i = 0; i < nSpans; ++i)
	{
		if (span[i].to->isBase)
		{
			const BitMap *b = BitMap::find (span[i].to);
			if (b && matches(b->go->span, b->go->nSpans, b->on, span, nSpans, span[i].to))
			{
				if (bitmap == NULL)
				{
					bitmap = b;
					bitmap_state = span[i].to;
				}
				nBitmaps++;
			}
		}
	}

	const uint32_t dSpans = nSpans - hSpans - nBitmaps;
	if (opts->target == opt_t::DOT)
	{
		type = DOT;
		info.dot = new Dot (span, nSpans, from);
	}
	else if (opts->gFlag && (dSpans >= opts->cGotoThreshold))
	{
		type = CPGOTO;
		info.cpgoto = new Cpgoto (span, nSpans, hspan, hSpans, from->next);
	}
	else if (opts->bFlag && (nBitmaps > 0))
	{
		type = BITMAP;
		info.bitmap = new GoBitmap (span, nSpans, hspan, hSpans, bitmap, bitmap_state, from->next);
		bUsedYYBitmap = true;
	}
	else
	{
		type = SWITCH_IF;
		info.switchif = new SwitchIf (span, nSpans, from->next);
	}
}